

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject ** correctgraylist(GCObject **p)

{
  byte bVar1;
  byte bVar2;
  GCObject **ppGVar3;
  GCObject *o;
  
LAB_0013df72:
  ppGVar3 = p;
  o = *ppGVar3;
  do {
    if (o == (GCObject *)0x0) {
      return ppGVar3;
    }
    p = getgclist(o);
    bVar1 = o->marked;
    if ((bVar1 & 0x18) == 0) {
      if ((bVar1 & 7) == 5) {
        o->marked = bVar1 & 0xdf ^ 0x23;
        goto LAB_0013df72;
      }
      if (o->tt == '\b') goto LAB_0013df72;
      bVar2 = bVar1 & 0xc4;
      if ((bVar1 & 7) != 6) {
        bVar2 = bVar1;
      }
      o->marked = bVar2 | 0x20;
    }
    o = *p;
    *ppGVar3 = o;
  } while( true );
}

Assistant:

static GCObject **correctgraylist (GCObject **p) {
  GCObject *curr;
  while ((curr = *p) != NULL) {
    GCObject **next = getgclist(curr);
    if (iswhite(curr))
      goto remove;  /* remove all white objects */
    else if (getage(curr) == G_TOUCHED1) {  /* touched in this cycle? */
      lua_assert(isgray(curr));
      nw2black(curr);  /* make it black, for next barrier */
      changeage(curr, G_TOUCHED1, G_TOUCHED2);
      goto remain;  /* keep it in the list and go to next element */
    }
    else if (curr->tt == LUA_VTHREAD) {
      lua_assert(isgray(curr));
      goto remain;  /* keep non-white threads on the list */
    }
    else {  /* everything else is removed */
      lua_assert(isold(curr));  /* young objects should be white here */
      if (getage(curr) == G_TOUCHED2)  /* advance from TOUCHED2... */
        changeage(curr, G_TOUCHED2, G_OLD);  /* ... to OLD */
      nw2black(curr);  /* make object black (to be removed) */
      goto remove;
    }
    remove: *p = *next; continue;
    remain: p = next; continue;
  }
  return p;
}